

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O1

aom_codec_err_t
av1_ext_part_create(aom_ext_part_funcs_t funcs,aom_ext_part_config_t config,
                   ExtPartController *ext_part_controller)

{
  aom_ext_part_status_t aVar1;
  
  if (ext_part_controller != (ExtPartController *)0x0) {
    (ext_part_controller->funcs).priv = funcs.priv;
    *(undefined4 *)&(ext_part_controller->funcs).delete_model = funcs.delete_model._0_4_;
    *(undefined4 *)((long)&(ext_part_controller->funcs).delete_model + 4) = funcs.delete_model._4_4_
    ;
    (ext_part_controller->funcs).decision_mode = funcs.decision_mode;
    *(undefined4 *)&(ext_part_controller->funcs).field_0x2c = funcs._44_4_;
    *(undefined4 *)&(ext_part_controller->funcs).get_partition_decision =
         funcs.get_partition_decision._0_4_;
    *(undefined4 *)((long)&(ext_part_controller->funcs).get_partition_decision + 4) =
         funcs.get_partition_decision._4_4_;
    *(undefined4 *)&(ext_part_controller->funcs).send_partition_stats =
         funcs.send_partition_stats._0_4_;
    *(undefined4 *)((long)&(ext_part_controller->funcs).send_partition_stats + 4) =
         funcs.send_partition_stats._4_4_;
    *(undefined4 *)&(ext_part_controller->funcs).create_model = funcs.create_model._0_4_;
    *(undefined4 *)((long)&(ext_part_controller->funcs).create_model + 4) = funcs.create_model._4_4_
    ;
    *(undefined4 *)&(ext_part_controller->funcs).send_features = funcs.send_features._0_4_;
    *(undefined4 *)((long)&(ext_part_controller->funcs).send_features + 4) =
         funcs.send_features._4_4_;
    (ext_part_controller->config).superblock_size = config.superblock_size;
    aVar1 = (*(ext_part_controller->funcs).create_model)
                      (funcs.priv,&ext_part_controller->config,&ext_part_controller->model);
    if (aVar1 != AOM_EXT_PART_ERROR) {
      if (aVar1 == AOM_EXT_PART_TEST) {
        ext_part_controller->test_mode = 1;
      }
      ext_part_controller->ready = (uint)(aVar1 != AOM_EXT_PART_TEST);
      aVar1 = AOM_EXT_PART_OK;
    }
    return aVar1;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

aom_codec_err_t av1_ext_part_create(aom_ext_part_funcs_t funcs,
                                    aom_ext_part_config_t config,
                                    ExtPartController *ext_part_controller) {
  if (ext_part_controller == NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  ext_part_controller->funcs = funcs;
  ext_part_controller->config = config;
  const aom_ext_part_status_t status = ext_part_controller->funcs.create_model(
      ext_part_controller->funcs.priv, &ext_part_controller->config,
      &ext_part_controller->model);
  if (status == AOM_EXT_PART_ERROR) {
    return AOM_CODEC_ERROR;
  } else if (status == AOM_EXT_PART_TEST) {
    ext_part_controller->test_mode = 1;
    ext_part_controller->ready = 0;
    return AOM_CODEC_OK;
  }
  assert(status == AOM_EXT_PART_OK);
  ext_part_controller->ready = 1;
  return AOM_CODEC_OK;
}